

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_60e82::SymlinkCommand::isResultValid
          (SymlinkCommand *this,BuildSystem *system,BuildValue *value)

{
  bool bVar1;
  uint uVar2;
  FileSystem *pFVar3;
  FileInfo *rhs;
  string local_b0;
  undefined1 local_90 [8];
  FileInfo info;
  StringRef outputPath;
  BuildValue *value_local;
  BuildSystem *system_local;
  SymlinkCommand *this_local;
  
  join_0x00000010_0x00000000_ = getActualOutputPath(this);
  bVar1 = std::
          vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
          ::empty(&(this->super_Command).outputs);
  if ((bVar1) || (outputPath.Data == (char *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = llbuild::buildsystem::BuildValue::isSuccessfulCommand(value);
    if (bVar1) {
      uVar2 = llbuild::buildsystem::BuildValue::getNumOutputs(value);
      if (uVar2 == 1) {
        pFVar3 = llbuild::buildsystem::BuildSystem::getFileSystem(system);
        llvm::StringRef::operator_cast_to_string
                  (&local_b0,(StringRef *)(info.checksum.bytes + 0x18));
        (*pFVar3->_vptr_FileSystem[8])(local_90,pFVar3,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        bVar1 = llbuild::basic::FileInfo::isMissing((FileInfo *)local_90);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          rhs = llbuild::buildsystem::BuildValue::getOutputInfo(value);
          this_local._7_1_ = llbuild::basic::FileInfo::operator==((FileInfo *)local_90,rhs);
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

virtual bool isResultValid(BuildSystem& system,
                             const BuildValue& value) override {
    // It is an error if this command isn't configured properly.
    StringRef outputPath = getActualOutputPath();
    if (outputs.empty() || outputPath.empty())
      return false;

    // If the prior value wasn't for a successful command, recompute.
    if (!value.isSuccessfulCommand())
      return false;

    // If the prior command doesn't look like one for a link, recompute.
    if (value.getNumOutputs() != 1)
      return false;

    // Otherwise, assume the result is valid if its link status matches the
    // previous one.
    auto info = system.getFileSystem().getLinkInfo(outputPath);
    if (info.isMissing())
      return false;

    return info == value.getOutputInfo();
  }